

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt5
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  byte bVar1;
  params *ppVar2;
  color_quad_u8 *pcVar3;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint64 s;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ushort uVar18;
  uint uVar19;
  bool bVar20;
  uint64 DD [8];
  uint64 D2 [8];
  uint64 hist [8];
  uint values [8];
  uint16 solutions [529];
  long local_538 [24];
  uint local_478 [8];
  ushort local_458 [532];
  
  uVar7 = (uint)(low_color->m_s[0] * 256.0);
  if (0xfe < (int)uVar7) {
    uVar7 = 0xff;
  }
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  uVar10 = (uint)(high_color->m_s[0] * 256.0);
  if (0xfe < (int)uVar10) {
    uVar10 = 0xff;
  }
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  local_538[0x16] = 0;
  local_538[0x17] = 0;
  local_538[0x14] = 0;
  local_538[0x15] = 0;
  local_538[0x12] = 0;
  local_538[0x13] = 0;
  local_538[0x10] = 0;
  local_538[0x11] = 0;
  local_538[0xe] = 0;
  local_538[0xf] = 0;
  local_538[0xc] = 0;
  local_538[0xd] = 0;
  local_538[10] = 0;
  local_538[0xb] = 0;
  local_538[8] = 0;
  local_538[9] = 0;
  local_538[6] = 0;
  local_538[7] = 0;
  local_538[4] = 0;
  local_538[5] = 0;
  local_538[2] = 0;
  local_538[3] = 0;
  local_538[0] = 0;
  local_538[1] = 0;
  ppVar2 = this->m_pParams;
  uVar11 = ppVar2->m_num_pixels;
  if ((ulong)uVar11 != 0) {
    uVar14 = ppVar2->m_alpha_comp_index;
    pcVar3 = ppVar2->m_pPixels;
    puVar4 = ppVar2->m_pSelectors;
    uVar16 = 0;
    do {
      bVar1 = pcVar3[uVar16].field_0.c[uVar14];
      uVar8 = (ulong)puVar4[uVar16];
      local_538[uVar8 + 0x10] = local_538[uVar8 + 0x10] + 1;
      local_538[uVar8 + 8] = local_538[uVar8 + 8] + (ulong)((uint)bVar1 + (uint)bVar1);
      local_538[uVar8] = local_538[uVar8] + (ulong)((uint)bVar1 * (uint)bVar1);
      uVar16 = uVar16 + 1;
    } while (uVar11 != uVar16);
  }
  uVar14 = uVar7 & 0xff;
  uVar11 = uVar10 & 0xff;
  if (uVar14 == uVar11) {
    if (uVar11 == 0) {
      local_458[0] = 1;
    }
    else {
      local_458[0] = ((ushort)uVar11 * 0x100 + (ushort)uVar14) - 0x100;
    }
  }
  else if (uVar11 < uVar14) {
    local_458[0] = (ushort)(uVar11 << 8) | (ushort)uVar14;
  }
  else {
    local_458[0] = (ushort)(uVar14 << 8) | (ushort)uVar11;
  }
  uVar13 = uVar7 + 0xf5;
  if (uVar14 < 0xc) {
    uVar13 = 0;
  }
  uVar5 = uVar7 + 0xb & 0xff;
  if (0xf3 < uVar14) {
    uVar5 = 0xff;
  }
  uVar13 = uVar13 & 0xff;
  uVar16 = 1;
  uVar17 = 1;
  if (uVar13 <= uVar5) {
    uVar15 = uVar10 + 0xf5 & 0xff;
    uVar6 = uVar10 + 0xb & 0xff;
    if (0xf3 < uVar11) {
      uVar6 = 0xff;
    }
    if (uVar11 < 0xc) {
      uVar15 = 0;
    }
    uVar19 = uVar13;
    do {
      if (uVar15 <= uVar6) {
        uVar8 = uVar16;
        iVar12 = uVar15 << 8;
        uVar17 = uVar15;
        do {
          uVar18 = (ushort)iVar12;
          uVar16 = uVar8;
          if (((uVar19 <= uVar17 || (uVar17 < uVar13 || uVar6 < uVar19)) &&
              (uVar10 != uVar17 || uVar14 != uVar19)) && (uVar7 != uVar17 || uVar11 != uVar19)) {
            if (uVar19 == uVar17) {
              if (uVar17 == 0) {
                uVar18 = 1;
              }
              else {
                uVar18 = uVar18 - 0x100;
LAB_00199de8:
                uVar18 = uVar18 | (ushort)uVar19;
              }
            }
            else {
              if (uVar17 < uVar19) goto LAB_00199de8;
              uVar18 = (ushort)(uVar19 << 8) | (ushort)uVar17;
            }
            uVar16 = (ulong)((int)uVar8 + 1);
            local_458[uVar8] = uVar18;
          }
          uVar17 = uVar17 + 1;
          iVar12 = iVar12 + 0x100;
          uVar8 = uVar16;
        } while (uVar6 + 1 != uVar17);
      }
      uVar17 = (uint)uVar16;
      bVar20 = uVar19 != uVar5;
      uVar19 = uVar19 + 1;
    } while (bVar20);
  }
  if (uVar17 != 0) {
    uVar16 = 0;
    do {
      uVar18 = local_458[uVar16];
      dxt5_block::get_block_values8(local_478,(uint)(byte)uVar18,(uint)(uVar18 >> 8));
      lVar9 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 + local_538[lVar9] +
                (local_538[lVar9 + 0x10] * (ulong)local_478[lVar9] - local_538[lVar9 + 8]) *
                (ulong)local_478[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      if (uVar8 < this->m_pResults->m_error) {
        this->m_pResults->m_low_color = uVar18 & 0xff;
        this->m_pResults->m_high_color = uVar18 >> 8;
        this->m_pResults->m_error = uVar8;
        if (this->m_pResults->m_error == 0) {
          return;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar17);
  }
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt5(vec3F low_color, vec3F high_color) {
  uint8 L0 = math::clamp<int>(low_color[0] * 256.0f, 0, 255);
  uint8 H0 = math::clamp<int>(high_color[0] * 256.0f, 0, 255);

  uint64 hist[8] = {}, D2[8] = {}, DD[8] = {};
  for (uint c = m_pParams->m_alpha_comp_index, i = 0; i < m_pParams->m_num_pixels; i++) {
    uint8 a = m_pParams->m_pPixels[i][c];
    uint8 s = m_pParams->m_pSelectors[i];
    hist[s]++;
    D2[s] += a * 2;
    DD[s] += a * a;
  }

  uint16 solutions[529];
  uint solutions_count = 0;
  solutions[solutions_count++] = L0 == H0 ? H0 ? H0 - 1 << 8 | L0 : 1 : L0 > H0 ? H0 << 8 | L0 : L0 << 8 | H0;
  uint8 minL = L0 <= 11 ? 0 : L0 - 11, maxL = L0 >= 244 ? 255 : L0 + 11;
  uint8 minH = H0 <= 11 ? 0 : H0 - 11, maxH = H0 >= 244 ? 255 : H0 + 11;
  for (uint16 L = minL; L <= maxL; L++) {
    for (uint16 H = minH; H <= maxH; H++) {
      if ((maxH < L || L <= H || H < minL) && (L != L0 || H != H0) && (L != H0 || H != L0))
        solutions[solutions_count++] = L == H ? H ? H - 1 << 8 | L : 1 : L > H ? H << 8 | L : L << 8 | H;
    }
  }

  for (uint i = 0; i < solutions_count; i++) {
    uint8 L = solutions[i] & 0xFF;
    uint8 H = solutions[i] >> 8;
    uint values[8];
    dxt5_block::get_block_values8(values, L, H);
    uint64 error = 0;
    for (uint64 s = 0; s < 8; s++)
      error += hist[s] * values[s] * values[s] - D2[s] * values[s] + DD[s];
    if (error < m_pResults->m_error) {
      m_pResults->m_low_color = L;
      m_pResults->m_high_color = H;
      m_pResults->m_error = error;
      if (!m_pResults->m_error)
        return;
    }
  }
}